

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intelligibility_enhancer.cc
# Opt level: O3

void __thiscall
webrtc::IntelligibilityEnhancer::SolveForGainsGivenLambda
          (IntelligibilityEnhancer *this,float lambda,size_t start_freq,float *sols)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  string *result;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar13;
  undefined1 auVar12 [16];
  float alpha0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  FatalMessage local_1a8;
  long lVar8;
  
  auVar3 = _DAT_0019c620;
  pfVar1 = (this->filtered_clear_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->filtered_noise_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (start_freq != 0) {
    lVar8 = start_freq - 1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar4 = 0;
    auVar12 = auVar12 ^ _DAT_0019c620;
    auVar7 = _DAT_0019dd40;
    auVar9 = _DAT_0019dd50;
    do {
      auVar10 = auVar9 ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar13 && auVar12._0_4_ < auVar10._0_4_ ||
                  iVar13 < auVar10._4_4_) & 1)) {
        sols[uVar4] = 1.0;
      }
      if ((auVar10._12_4_ != auVar12._12_4_ || auVar10._8_4_ <= auVar12._8_4_) &&
          auVar10._12_4_ <= auVar12._12_4_) {
        sols[uVar4 + 1] = 1.0;
      }
      auVar10 = auVar7 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar13 && (iVar11 != iVar13 || auVar10._0_4_ <= auVar12._0_4_)) {
        sols[uVar4 + 2] = 1.0;
        sols[uVar4 + 3] = 1.0;
      }
      uVar4 = uVar4 + 4;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
    } while ((start_freq + 3 & 0xfffffffffffffffc) != uVar4);
  }
  uVar4 = this->bank_size_;
  if (start_freq < uVar4) {
    local_1b8 = lambda;
    do {
      local_1ac = pfVar1[start_freq];
      if ((local_1ac < 1e-05) || (local_1b0 = pfVar2[start_freq], local_1b0 < 1e-05)) {
        sols[start_freq] = 1.0;
      }
      else {
        local_1b4 = local_1ac * lambda;
        local_1bc = local_1b4 * 0.9996 * local_1ac * local_1ac;
        local_1a8.stream_ = (ostringstream)0x0;
        local_1a8._1_3_ = 0;
        if (0.0 <= local_1bc) {
          result = rtc::MakeCheckOpString<float,float>
                             (&local_1bc,(float *)&local_1a8,"alpha0 < 0.f");
          if (result != (string *)0x0) {
            rtc::FatalMessage::FatalMessage
                      (&local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/intelligibility/intelligibility_enhancer.cc"
                       ,0x145,result);
            rtc::FatalMessage::~FatalMessage(&local_1a8);
          }
          uVar4 = this->bank_size_;
          lambda = local_1b8;
        }
        fVar5 = local_1b4 * 1.9996 * local_1ac * local_1b0;
        fVar6 = fVar5 * fVar5 +
                local_1bc * -4.0 *
                (local_1ac * 0.0002 * local_1b0 + local_1b4 * local_1b0 * local_1b0);
        if (fVar6 <= 0.0) {
          fVar6 = 0.0;
        }
        fVar6 = (-fVar5 - SQRT(fVar6)) / (local_1bc + local_1bc);
        if (fVar6 <= 0.0) {
          fVar6 = 0.0;
        }
        sols[start_freq] = fVar6;
      }
      start_freq = start_freq + 1;
    } while (start_freq < uVar4);
  }
  return;
}

Assistant:

void IntelligibilityEnhancer::SolveForGainsGivenLambda(float lambda,
                                                       size_t start_freq,
                                                       float* sols) {
  const float kMinPower = 1e-5f;

  const float* pow_x0 = filtered_clear_pow_.data();
  const float* pow_n0 = filtered_noise_pow_.data();

  for (size_t n = 0; n < start_freq; ++n) {
    sols[n] = 1.f;
  }

  // Analytic solution for optimal gains. See paper for derivation.
  for (size_t n = start_freq; n < bank_size_; ++n) {
    if (pow_x0[n] < kMinPower || pow_n0[n] < kMinPower) {
      sols[n] = 1.f;
    } else {
      const float gamma0 = 0.5f * kRho * pow_x0[n] * pow_n0[n] +
                           lambda * pow_x0[n] * pow_n0[n] * pow_n0[n];
      const float beta0 =
          lambda * pow_x0[n] * (2.f - kRho) * pow_x0[n] * pow_n0[n];
      const float alpha0 =
          lambda * pow_x0[n] * (1.f - kRho) * pow_x0[n] * pow_x0[n];
      RTC_DCHECK_LT(alpha0, 0.f);
      // The quadratic equation should always have real roots, but to guard
      // against numerical errors we limit it to a minimum of zero.
      sols[n] = std::max(
          0.f, (-beta0 - std::sqrt(std::max(
                             0.f, beta0 * beta0 - 4.f * alpha0 * gamma0))) /
                   (2.f * alpha0));
    }
  }
}